

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlnamePush(htmlParserCtxtPtr ctxt,xmlChar *value)

{
  int iVar1;
  int extraout_EAX;
  xmlChar **ppxVar2;
  
  if (ctxt->html < 3) {
    iVar1 = xmlStrEqual(value,"head");
    if (iVar1 != 0) {
      ctxt->html = 3;
    }
  }
  if (ctxt->html < 10) {
    iVar1 = xmlStrEqual(value,"body");
    if (iVar1 != 0) {
      ctxt->html = 10;
    }
  }
  iVar1 = ctxt->nameMax;
  if (iVar1 <= ctxt->nameNr) {
    ctxt->nameMax = iVar1 * 2;
    ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,(long)iVar1 << 4);
    ctxt->nameTab = ppxVar2;
    if (ppxVar2 == (xmlChar **)0x0) {
      htmlErrMemory(ctxt,(char *)0x0);
      return extraout_EAX;
    }
  }
  iVar1 = ctxt->nameNr;
  ctxt->nameTab[iVar1] = value;
  ctxt->name = value;
  iVar1 = iVar1 + 1;
  ctxt->nameNr = iVar1;
  return iVar1;
}

Assistant:

static int
htmlnamePush(htmlParserCtxtPtr ctxt, const xmlChar * value)
{
    if ((ctxt->html < 3) && (xmlStrEqual(value, BAD_CAST "head")))
        ctxt->html = 3;
    if ((ctxt->html < 10) && (xmlStrEqual(value, BAD_CAST "body")))
        ctxt->html = 10;
    if (ctxt->nameNr >= ctxt->nameMax) {
        ctxt->nameMax *= 2;
        ctxt->nameTab = (const xmlChar * *)
                         xmlRealloc((xmlChar * *)ctxt->nameTab,
                                    ctxt->nameMax *
                                    sizeof(ctxt->nameTab[0]));
        if (ctxt->nameTab == NULL) {
            htmlErrMemory(ctxt, NULL);
            return (0);
        }
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    return (ctxt->nameNr++);
}